

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_search.cc
# Opt level: O0

void __thiscall SequenceLabelerTask::SequenceLabelerTask(SequenceLabelerTask *this,vw *vw_obj)

{
  task_data *ptVar1;
  ostream *this_00;
  void *this_01;
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  task_data *d;
  uint32_t in_stack_0000018c;
  search *in_stack_00000190;
  vw *in_stack_ffffffffffffffe8;
  
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::SearchTask(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__SequenceLabelerTask_0048aa60;
  Search::search::set_options(in_stack_00000190,in_stack_0000018c);
  ptVar1 = Search::search::get_task_data<HookTask::task_data>((search *)in_RDI[2]);
  this_00 = std::operator<<((ostream *)&std::cerr,"num_actions = ");
  this_01 = (void *)std::ostream::operator<<(this_00,ptVar1->num_actions);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

SequenceLabelerTask(vw& vw_obj)
    : SearchTask< vector<wt>, vector<uint32_t> >(vw_obj)    // must run parent constructor!
  { sch.set_options( Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES );
    HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    cerr << "num_actions = " << d->num_actions << endl;
  }